

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReaderInit(SortSubtask *pTask,SorterFile *pFile,i64 iStart,PmaReader *pReadr,i64 *pnByte)

{
  u64 local_40;
  u64 nByte;
  i64 *piStack_30;
  int rc;
  i64 *pnByte_local;
  PmaReader *pReadr_local;
  i64 iStart_local;
  SorterFile *pFile_local;
  SortSubtask *pTask_local;
  
  piStack_30 = pnByte;
  pnByte_local = &pReadr->iReadOff;
  pReadr_local = (PmaReader *)iStart;
  iStart_local = (i64)pFile;
  pFile_local = (SorterFile *)pTask;
  nByte._4_4_ = vdbePmaReaderSeek(pTask,pReadr,pFile,iStart);
  if (nByte._4_4_ == 0) {
    local_40 = 0;
    nByte._4_4_ = vdbePmaReadVarint((PmaReader *)pnByte_local,&local_40);
    pnByte_local[1] = *pnByte_local + local_40;
    *piStack_30 = local_40 + *piStack_30;
  }
  if (nByte._4_4_ == 0) {
    nByte._4_4_ = vdbePmaReaderNext((PmaReader *)pnByte_local);
  }
  return nByte._4_4_;
}

Assistant:

static int vdbePmaReaderInit(
  SortSubtask *pTask,             /* Task context */
  SorterFile *pFile,              /* Sorter file to read from */
  i64 iStart,                     /* Start offset in pFile */
  PmaReader *pReadr,              /* PmaReader to populate */
  i64 *pnByte                     /* IN/OUT: Increment this value by PMA size */
){
  int rc;

  assert( pFile->iEof>iStart );
  assert( pReadr->aAlloc==0 && pReadr->nAlloc==0 );
  assert( pReadr->aBuffer==0 );
  assert( pReadr->aMap==0 );

  rc = vdbePmaReaderSeek(pTask, pReadr, pFile, iStart);
  if( rc==SQLITE_OK ){
    u64 nByte = 0;                 /* Size of PMA in bytes */
    rc = vdbePmaReadVarint(pReadr, &nByte);
    pReadr->iEof = pReadr->iReadOff + nByte;
    *pnByte += nByte;
  }

  if( rc==SQLITE_OK ){
    rc = vdbePmaReaderNext(pReadr);
  }
  return rc;
}